

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tilt-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::TiltEstimator::TiltEstimator
          (TiltEstimator *this,double alpha,double beta,double gamma)

{
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_78;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_68;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_58;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_47 [5];
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_38;
  double local_28;
  double gamma_local;
  double beta_local;
  double alpha_local;
  TiltEstimator *this_local;
  
  local_28 = gamma;
  gamma_local = beta;
  beta_local = alpha;
  alpha_local = (double)this;
  ZeroDelayObserver::ZeroDelayObserver(&this->super_ZeroDelayObserver,9,6,0);
  (this->super_ZeroDelayObserver).super_ObserverBase._vptr_ObserverBase =
       (_func_int **)&PTR__TiltEstimator_0046c798;
  this->alpha_ = beta_local;
  this->beta_ = gamma_local;
  this->gamma_ = local_28;
  this->dt_ = 0.005;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->p_S_C_,&local_38);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)&this->R_S_C_,local_47);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->v_S_C_,&local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->w_S_C_,&local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->v_C_,&local_78);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->x1_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->x1_hat_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->x2_hat_prime_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->x2_hat_);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->dx1_hat);
  return;
}

Assistant:

TiltEstimator::TiltEstimator(double alpha, double beta, double gamma)
: ZeroDelayObserver(9, 6), alpha_(alpha), beta_(beta), gamma_(gamma), dt_(0.005), p_S_C_(Vector3::Zero()),
  R_S_C_(Matrix3::Identity()), v_S_C_(Vector3::Zero()), w_S_C_(Vector3::Zero()), v_C_(Vector3::Zero())
{
}